

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 GenStateCompileSwitchBlock(jx9_gen_state *pGen,sxu32 *pBlockStart)

{
  sxi32 sVar1;
  SyToken *pSVar2;
  
  pSVar2 = pGen->pIn;
  sVar1 = 0;
  while ((pSVar2 < pGen->pEnd && ((pSVar2->nType & 0x140000) == 0))) {
    sVar1 = jx9GenCompileError(pGen,1,pSVar2->nLine,"Unexpected token \'%z\'");
    if (sVar1 == -10) {
      return -10;
    }
    pSVar2 = pGen->pIn + 1;
    pGen->pIn = pSVar2;
  }
  pGen->pIn = pSVar2 + 1;
  *pBlockStart = pGen->pVm->pByteContainer->nUsed;
  do {
    pSVar2 = pGen->pIn;
    if (pGen->pEnd <= pSVar2) {
      return sVar1;
    }
    if ((pSVar2->nType & 4) == 0) {
      if ((char)pSVar2->nType < '\0') {
        return -0x12;
      }
    }
    else {
      if (*(int *)&pSVar2->pUserData == 5) {
        return 0;
      }
      if (*(int *)&pSVar2->pUserData == 10) {
        return 0;
      }
    }
    sVar1 = jx9CompileBlock(pGen);
    if (sVar1 == -10) {
      return -10;
    }
  } while( true );
}

Assistant:

static sxi32 GenStateCompileSwitchBlock(jx9_gen_state *pGen,sxu32 *pBlockStart)
{
	sxi32 rc = SXRET_OK;
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI/*';'*/|JX9_TK_COLON/*':'*/)) == 0 ){
		/* Unexpected token */
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pGen->pIn++;
	/* First instruction to execute in this block. */
	*pBlockStart = jx9VmInstrLength(pGen->pVm);
	/* Compile the block until we hit a case/default/endswitch keyword
	 * or the '}' token */
	for(;;){
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		rc = SXRET_OK;
		if( (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			if( pGen->pIn->nType & JX9_TK_CCB /*'}' */ ){
				rc = SXERR_EOF;
				break;
			}
		}else{
			sxi32 nKwrd;
			/* Extract the keyword */
			nKwrd = SX_PTR_TO_INT(pGen->pIn->pUserData);
			if( nKwrd == JX9_TKWRD_CASE || nKwrd == JX9_TKWRD_DEFAULT ){
				break;
			}
		}
		/* Compile block */
		rc = jx9CompileBlock(&(*pGen));
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
	}
	return rc;
}